

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitWhileStatement(CodegenVisitor *this,WhileStatement *whileLoop)

{
  SQObjectPtrVec *this_00;
  SQScope *pSVar1;
  SQInteger *val;
  size_type *psVar2;
  size_type sVar3;
  uint uVar4;
  size_type sVar5;
  SQInteger SVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  SQFuncState *funcstate;
  SQFuncState *pSVar10;
  ulong targetpos;
  long lVar11;
  SQScope __oldscope___1;
  SQObject local_58;
  SQScope __oldscope__;
  
  addLineNumber(this,(Statement *)whileLoop);
  __oldscope__.outers = (this->_scope).outers;
  __oldscope__.stacksize = (this->_scope).stacksize;
  pSVar10 = this->_fs;
  (this->_scope).outers = pSVar10->_outers;
  SVar6 = SQFuncState::GetStackSize(pSVar10);
  (this->_scope).stacksize = SVar6;
  this_00 = &this->_scopedconsts;
  __oldscope___1.stacksize = 0;
  __oldscope___1.outers = 0x1000001;
  sqvector<SQObjectPtr,_unsigned_int>::push_back(this_00,(SQObjectPtr *)&__oldscope___1);
  pSVar1 = &this->_scope;
  val = &(this->_scope).stacksize;
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&__oldscope___1);
  sVar3 = (this->_fs->_instructions)._size;
  visitForceGet(this,&whileLoop->_cond->super_Node);
  pSVar10 = this->_fs;
  uVar4 = (pSVar10->_unresolvedbreaks)._size;
  uVar7 = (ulong)(pSVar10->_unresolvedcontinues)._size;
  __oldscope___1.outers = 0;
  sqvector<long,_unsigned_int>::push_back(&pSVar10->_breaktargets,&__oldscope___1.outers);
  __oldscope___1.outers = 0;
  sqvector<long,_unsigned_int>::push_back(&this->_fs->_continuetargets,&__oldscope___1.outers);
  sqvector<long,_unsigned_int>::push_back(&this->_fs->_blockstacksizes,val);
  pSVar10 = this->_fs;
  SVar6 = SQFuncState::PopTarget(pSVar10);
  SQFuncState::AddInstruction(pSVar10,_OP_JZ,SVar6,0,0,0);
  pSVar10 = this->_fs;
  sVar5 = (pSVar10->_instructions)._size;
  __oldscope___1.outers = pSVar1->outers;
  __oldscope___1.stacksize = (this->_scope).stacksize;
  (this->_scope).outers = pSVar10->_outers;
  SVar6 = SQFuncState::GetStackSize(pSVar10);
  (this->_scope).stacksize = SVar6;
  local_58._unVal.pTable = (SQTable *)0x0;
  local_58._type = OT_NULL;
  local_58._flags = '\0';
  local_58._5_3_ = 0;
  sqvector<SQObjectPtr,_unsigned_int>::push_back(this_00,(SQObjectPtr *)&local_58);
  targetpos = (ulong)(sVar3 - 1);
  uVar8 = (ulong)(sVar5 - 1);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&local_58);
  Node::visit<SQCompilation::CodegenVisitor>
            (&((whileLoop->super_LoopStatement)._body)->super_Node,this);
  lVar9 = this->_fs->_outers;
  SVar6 = SQFuncState::GetStackSize(this->_fs);
  lVar11 = (this->_scope).stacksize;
  if (SVar6 != lVar11) {
    SQFuncState::SetStackSize(this->_fs,lVar11);
    if (lVar9 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,*val,0,0);
    }
  }
  pSVar1->outers = __oldscope___1.outers;
  (this->_scope).stacksize = __oldscope___1.stacksize;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back(this_00);
  SQFuncState::AddInstruction
            (this->_fs,_OP_JMP,0,~(ulong)((this->_fs->_instructions)._size - 1) + targetpos,0,0);
  pSVar10 = this->_fs;
  SQFuncState::SetInstructionParam(pSVar10,uVar8,1,((pSVar10->_instructions)._size - 1) - uVar8);
  funcstate = this->_fs;
  uVar8 = (ulong)(funcstate->_unresolvedcontinues)._size;
  lVar11 = (ulong)(funcstate->_unresolvedbreaks)._size - (ulong)uVar4;
  lVar9 = uVar8 - uVar7;
  if (lVar9 != 0 && uVar7 <= uVar8) {
    ResolveContinues((CodegenVisitor *)pSVar10,funcstate,lVar9,targetpos);
    funcstate = this->_fs;
  }
  if (0 < lVar11) {
    ResolveBreaks((CodegenVisitor *)pSVar10,funcstate,lVar11);
    funcstate = this->_fs;
  }
  psVar2 = &(funcstate->_breaktargets)._size;
  *psVar2 = *psVar2 - 1;
  psVar2 = &(funcstate->_continuetargets)._size;
  *psVar2 = *psVar2 - 1;
  psVar2 = &(funcstate->_blockstacksizes)._size;
  *psVar2 = *psVar2 - 1;
  lVar9 = funcstate->_outers;
  SVar6 = SQFuncState::GetStackSize(funcstate);
  if (SVar6 != *val) {
    SQFuncState::SetStackSize(this->_fs,*val);
    if (lVar9 != this->_fs->_outers) {
      SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,*val,0,0);
    }
  }
  pSVar1->outers = __oldscope__.outers;
  (this->_scope).stacksize = __oldscope__.stacksize;
  sqvector<SQObjectPtr,_unsigned_int>::pop_back(this_00);
  return;
}

Assistant:

void CodegenVisitor::visitWhileStatement(WhileStatement *whileLoop) {
    addLineNumber(whileLoop);

    BEGIN_SCOPE();
    {
        SQInteger jmppos = _fs->GetCurrentPos();

        visitForceGet(whileLoop->condition());

        BEGIN_BREAKABLE_BLOCK();

        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());

        SQInteger jzpos = _fs->GetCurrentPos();

        BEGIN_SCOPE();

        whileLoop->body()->visit(this);

        END_SCOPE();

        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetInstructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKABLE_BLOCK(jmppos);
    }
    END_SCOPE();
}